

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_parameter_validation.cpp
# Opt level: O3

ze_result_t __thiscall
validation_layer::ZETParameterValidation::zetTracerExpCreatePrologue
          (ZETParameterValidation *this,zet_context_handle_t hContext,zet_tracer_exp_desc_t *desc,
          zet_tracer_exp_handle_t *phTracer)

{
  pointer p_Var1;
  ze_result_t zVar2;
  initializer_list<_zet_structure_type_t> __l;
  vector<_zet_structure_type_t,_std::allocator<_zet_structure_type_t>_> baseTypes;
  allocator_type local_2d;
  _zet_structure_type_t local_2c;
  vector<_zet_structure_type_t,_std::allocator<_zet_structure_type_t>_> local_28;
  
  if (hContext == (zet_context_handle_t)0x0) {
    zVar2 = ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
  }
  else {
    zVar2 = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
    if (((desc != (zet_tracer_exp_desc_t *)0x0) && (phTracer != (zet_tracer_exp_handle_t *)0x0)) &&
       (desc->pUserData != (void *)0x0)) {
      local_2c = ZET_STRUCTURE_TYPE_TRACER_EXP_DESC;
      __l._M_len = 1;
      __l._M_array = &local_2c;
      std::vector<_zet_structure_type_t,_std::allocator<_zet_structure_type_t>_>::vector
                (&local_28,__l,&local_2d);
      zVar2 = ZE_RESULT_ERROR_INVALID_ARGUMENT;
      if (local_28.super__Vector_base<_zet_structure_type_t,_std::allocator<_zet_structure_type_t>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_28.super__Vector_base<_zet_structure_type_t,_std::allocator<_zet_structure_type_t>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        p_Var1 = local_28.
                 super__Vector_base<_zet_structure_type_t,_std::allocator<_zet_structure_type_t>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        do {
          if (desc->stype == *p_Var1) {
            if (((int *)desc->pNext == (int *)0x0) || (*desc->pNext < 0x100000)) {
              zVar2 = ZE_RESULT_SUCCESS;
            }
            break;
          }
          p_Var1 = p_Var1 + 1;
        } while (p_Var1 != local_28.
                           super__Vector_base<_zet_structure_type_t,_std::allocator<_zet_structure_type_t>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
      }
      if (local_28.super__Vector_base<_zet_structure_type_t,_std::allocator<_zet_structure_type_t>_>
          ._M_impl.super__Vector_impl_data._M_start != (zet_structure_type_t *)0x0) {
        operator_delete(local_28.
                        super__Vector_base<_zet_structure_type_t,_std::allocator<_zet_structure_type_t>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_28.
                              super__Vector_base<_zet_structure_type_t,_std::allocator<_zet_structure_type_t>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_28.
                              super__Vector_base<_zet_structure_type_t,_std::allocator<_zet_structure_type_t>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
    }
  }
  return zVar2;
}

Assistant:

ze_result_t
    ZETParameterValidation::zetTracerExpCreatePrologue(
        zet_context_handle_t hContext,                  ///< [in] handle of the context object
        const zet_tracer_exp_desc_t* desc,              ///< [in] pointer to tracer descriptor
        zet_tracer_exp_handle_t* phTracer               ///< [out] pointer to handle of tracer object created
        )
    {
        if( nullptr == hContext )
            return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;

        if( nullptr == desc )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( nullptr == desc->pUserData )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( nullptr == phTracer )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        return ParameterValidation::validateExtensions(desc);
    }